

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * httplib::detail::decode_url(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  undefined1 uVar4;
  uint uVar5;
  ulong in_RAX;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  char cVar10;
  int i;
  int iVar11;
  undefined8 uStack_38;
  char buff [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar11 = 0;
  uStack_38 = in_RAX;
  do {
    lVar6 = (long)iVar11;
    pcVar2 = (s->_M_dataplus)._M_p;
    cVar1 = pcVar2[lVar6];
    cVar10 = (char)__return_storage_ptr__;
    if (cVar1 == '%') {
      if (pcVar2[lVar6 + 1] == 'u') {
        lVar6 = 0;
        uVar5 = 0;
        do {
          cVar1 = pcVar2[lVar6 + (iVar11 + 2)];
          iVar8 = (int)cVar1;
          if (cVar1 == '\0') {
LAB_0011afb1:
            std::__cxx11::string::push_back(cVar10);
            goto LAB_0011aeca;
          }
          uVar9 = iVar8 - 0x30;
          if (cVar1 < ' ' || 9 < uVar9) {
            if ((byte)(cVar1 + 0xbfU) < 6) {
              uVar9 = iVar8 - 0x37;
            }
            else {
              if (5 < (byte)(cVar1 + 0x9fU)) goto LAB_0011afb1;
              uVar9 = iVar8 - 0x57;
            }
          }
          uVar5 = uVar5 * 0x10 + uVar9;
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 4);
        uVar4 = (undefined1)uVar5;
        if ((int)uVar5 < 0x80) {
          uStack_38 = CONCAT35(uStack_38._5_3_,CONCAT14(uVar4,(undefined4)uStack_38)) &
                      0xffffff7fffffffff;
LAB_0011b021:
          std::__cxx11::string::append((char *)__return_storage_ptr__,(long)&uStack_38 + 4);
        }
        else {
          if (uVar5 < 0x800) {
            uStack_38 = CONCAT26(uStack_38._6_2_,
                                 CONCAT15(uVar4,CONCAT14((char)(uVar5 >> 6),(undefined4)uStack_38)))
                        & 0xffff3fffffffffff | 0x80c000000000;
            goto LAB_0011b021;
          }
          if (uVar5 < 0xd800) {
LAB_0011affc:
            uVar3 = CONCAT26(uStack_38._6_2_,
                             CONCAT15((char)(uVar5 >> 6),
                                      CONCAT14((char)(uVar5 >> 0xc),(undefined4)uStack_38))) &
                    0xffff3fffffffffff;
            uStack_38._7_1_ = (undefined1)(uVar3 >> 0x38);
            uStack_38 = CONCAT17(uStack_38._7_1_,CONCAT16(uVar4,(int6)uVar3)) & 0xff3fffffffffffff |
                        0x8080e000000000;
            goto LAB_0011b021;
          }
          if (0xdfff < uVar5) {
            if (uVar5 < 0x10000) goto LAB_0011affc;
            if (uVar5 < 0x110000) {
              uStack_38 = CONCAT17(uVar4,CONCAT16((char)(uVar5 >> 6),
                                                  CONCAT15((char)(uVar5 >> 0xc),
                                                           CONCAT14((char)(uVar5 >> 0x12),
                                                                    (undefined4)uStack_38)))) &
                          0x3f3f3fffffffffff | 0x808080f000000000;
              goto LAB_0011b021;
            }
          }
        }
        iVar11 = iVar11 + 5;
      }
      else {
        lVar7 = 0;
        do {
          cVar1 = pcVar2[lVar7 + lVar6 + 1];
          if ((cVar1 == '\0') ||
             (((cVar1 < ' ' || 9 < (int)cVar1 - 0x30U && (5 < (byte)(cVar1 + 0xbfU))) &&
              (5 < (byte)(cVar1 + 0x9fU))))) {
            std::__cxx11::string::push_back(cVar10);
            goto LAB_0011aeca;
          }
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 != 2);
        std::__cxx11::string::push_back(cVar10);
        iVar11 = iVar11 + 2;
      }
    }
    else {
      if ((cVar1 != '+') && (cVar1 == '\0')) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back(cVar10);
    }
LAB_0011aeca:
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

inline std::string decode_url(const std::string& s)
{
    std::string result;

    for (int i = 0; s[i]; i++) {
        if (s[i] == '%') {
            if (s[i + 1] && s[i + 1] == 'u') {
                int val = 0;
                if (from_hex_to_i(s, i + 2, 4, val)) {
                    // 4 digits Unicode codes
                    char buff[4];
                    size_t len = to_utf8(val, buff);
                    if (len > 0) {
                        result.append(buff, len);
                    }
                    i += 5; // 'u0000'
                } else {
                    result += s[i];
                }
            } else {
                int val = 0;
                if (from_hex_to_i(s, i + 1, 2, val)) {
                    // 2 digits hex codes
                    result += val;
                    i += 2; // '00'
                } else {
                    result += s[i];
                }
            }
        } else if (s[i] == '+') {
            result += ' ';
        } else {
            result += s[i];
        }
    }

    return result;
}